

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_AddIntrinsicBaseObjects(JSContext *ctx)

{
  long lVar1;
  JSValue proto;
  JSValue proto_00;
  JSValue proto_01;
  JSValue proto_02;
  JSValue proto_03;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue obj_04;
  JSValue obj_05;
  JSValue val;
  JSValue obj_06;
  JSValue obj_07;
  JSValue proto_val;
  JSValue obj_08;
  JSValue obj_09;
  JSValue proto_val_00;
  JSValue obj_10;
  JSValue proto_val_01;
  JSValue obj_11;
  JSValue obj_12;
  JSValue obj_13;
  JSValue obj_14;
  JSValue obj_15;
  JSValue obj_16;
  JSValue obj_17;
  JSValue val_00;
  JSValue obj_18;
  JSValue obj_19;
  JSValue proto_04;
  JSValue proto_05;
  JSValue val_01;
  JSValue proto_06;
  JSValue val_02;
  JSValue proto_07;
  JSValue val_03;
  JSValue proto_08;
  JSValue proto_09;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue obj_20;
  JSValue obj_21;
  JSValue obj_22;
  JSValue proto_10;
  JSValue proto_11;
  JSValue proto_12;
  JSValue proto_13;
  JSValue proto_14;
  JSValue func_obj_00;
  JSValue func_obj_01;
  JSValue func_obj_02;
  JSValue func_obj_03;
  JSValue func_obj_04;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue proto_val_02;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue this_val;
  JSValue obj_23;
  JSValue val_07;
  JSValue val_08;
  JSValue this_obj_04;
  JSValue this_obj_05;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  JSValueUnion in_RDI;
  JSValue JVar4;
  char *p_1;
  char *str;
  char buf [64];
  char *p;
  char unscopables [74];
  int n_args;
  JSValue func_obj;
  JSValue obj1;
  JSValue number_obj;
  JSValue obj;
  int i;
  JSCFunctionEnum JVar5;
  int in_stack_fffffffffffffaec;
  JSAtom atom;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffaf4;
  int length;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffafc;
  JSClassID class_id;
  JSContext *in_stack_fffffffffffffb00;
  JSContext *ctx_00;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 uVar9;
  int in_stack_fffffffffffffb14;
  undefined4 uVar10;
  JSCFunctionEnum in_stack_fffffffffffffb18;
  undefined4 uVar11;
  int in_stack_fffffffffffffb1c;
  int proto_flags;
  JSValueUnion in_stack_fffffffffffffb20;
  JSValueUnion JVar12;
  JSCFunction *in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb30;
  JSAtom in_stack_fffffffffffffb34;
  JSAtom prop;
  JSValueUnion in_stack_fffffffffffffb38;
  JSValueUnion in_stack_fffffffffffffb40;
  JSValueUnion in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  int64_t in_stack_fffffffffffffb58;
  JSValueUnion JVar13;
  int in_stack_fffffffffffffb70;
  int iVar14;
  undefined8 in_stack_fffffffffffffbb0;
  JSContext *in_stack_fffffffffffffbc8;
  JSValueUnion in_stack_fffffffffffffbd0;
  int64_t in_stack_fffffffffffffbd8;
  JSValueUnion local_3f8;
  int64_t local_3f0;
  JSValueUnion local_3d8;
  int64_t local_3d0;
  undefined1 in_stack_fffffffffffffc38 [16];
  undefined1 auVar15 [12];
  JSValue in_stack_fffffffffffffc48;
  JSValueUnion in_stack_fffffffffffffc58;
  int64_t in_stack_fffffffffffffc60;
  JSValueUnion local_340;
  int64_t local_338;
  JSValueUnion local_330;
  int64_t local_328;
  BOOL throw_ref_error;
  undefined1 in_stack_fffffffffffffce0 [16];
  JSContext *in_stack_fffffffffffffcf0;
  JSValueUnion in_stack_fffffffffffffcf8;
  int64_t in_stack_fffffffffffffd00;
  JSValueUnion in_stack_fffffffffffffd08;
  int64_t in_stack_fffffffffffffd10;
  JSValueUnion local_2d0;
  int64_t iStack_2c8;
  JSValueUnion local_2a0;
  int64_t iStack_298;
  JSValueUnion local_290;
  int64_t iStack_288;
  char *local_240;
  char local_238 [88];
  JSValue in_stack_fffffffffffffe20;
  JSValue in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe40;
  int64_t local_1b8;
  JSValueUnion local_168;
  int64_t local_160;
  JSValueUnion local_138;
  int64_t local_130;
  JSValueUnion local_128;
  int64_t local_120;
  JSValueUnion local_c8;
  int64_t local_c0;
  int local_7c;
  JSValueUnion local_50;
  int64_t local_48;
  
  iVar14 = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  JVar13 = in_RDI;
  JVar4 = JS_NewCFunction(in_stack_fffffffffffffb00,
                          (JSCFunction *)
                          CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                          (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                          in_stack_fffffffffffffaec);
  local_c8 = JVar4.u;
  *(JSValueUnion *)((long)JVar13.ptr + 0x148) = local_c8;
  local_c0 = JVar4.tag;
  *(int64_t *)((long)JVar13.ptr + 0x150) = local_c0;
  JVar4 = JS_NewCFunction(in_stack_fffffffffffffb00,
                          (JSCFunction *)
                          CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                          (char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                          in_stack_fffffffffffffaec);
  this_obj_04.tag = in_stack_fffffffffffffd10;
  this_obj_04.u.ptr = in_stack_fffffffffffffd08.ptr;
  val_07.tag = in_stack_fffffffffffffd00;
  val_07.u.ptr = in_stack_fffffffffffffcf8.ptr;
  JS_DefineProperty(in_stack_fffffffffffffcf0,this_obj_04,in_stack_fffffffffffffce0._12_4_,val_07,
                    in_stack_fffffffffffffe20,in_stack_fffffffffffffe30,in_stack_fffffffffffffe40);
  JVar5 = JVar4.u._0_4_;
  atom = JVar4.u._4_4_;
  uVar6 = (undefined4)JVar4.tag;
  length = JVar4.tag._4_4_;
  uVar7 = (undefined4)*(undefined8 *)((long)in_RDI.ptr + 0x148);
  class_id = (JSClassID)((ulong)*(undefined8 *)((long)in_RDI.ptr + 0x148) >> 0x20);
  ctx_00 = *(JSContext **)((long)in_RDI.ptr + 0x150);
  uVar8 = 0x1901;
  this_obj_05.tag = in_stack_fffffffffffffd10;
  this_obj_05.u.ptr = in_stack_fffffffffffffd08.ptr;
  val_08.tag = in_stack_fffffffffffffd00;
  val_08.u.ptr = in_stack_fffffffffffffcf8.ptr;
  JS_DefineProperty(in_stack_fffffffffffffcf0,this_obj_05,in_stack_fffffffffffffce0._12_4_,val_08,
                    in_stack_fffffffffffffe20,in_stack_fffffffffffffe30,in_stack_fffffffffffffe40);
  v.u._4_4_ = class_id;
  v.u.int32 = uVar7;
  v.tag = (int64_t)ctx_00;
  JS_FreeValue((JSContext *)CONCAT44(length,uVar6),v);
  this_val.tag = in_stack_fffffffffffffbd8;
  this_val.u.float64 = in_stack_fffffffffffffbd0.float64;
  prop = in_RDI._4_4_;
  js_object_seal(in_stack_fffffffffffffbc8,this_val,prop,(JSValue *)JVar13.ptr,iVar14);
  v_00.u._4_4_ = class_id;
  v_00.u.int32 = uVar7;
  v_00.tag = (int64_t)ctx_00;
  JS_FreeValue((JSContext *)CONCAT44(length,uVar6),v_00);
  JVar13 = in_RDI;
  JVar4 = JS_NewObject((JSContext *)0x11e9cf);
  local_128 = JVar4.u;
  *(JSValueUnion *)((long)JVar13.ptr + 0x168) = local_128;
  local_120 = JVar4.tag;
  *(int64_t *)((long)JVar13.ptr + 0x170) = local_120;
  JVar4.u._4_4_ = atom;
  JVar4.u.int32 = JVar5;
  JVar4.tag._0_4_ = uVar6;
  JVar4.tag._4_4_ = length;
  JVar13 = in_RDI;
  JVar4 = JS_NewObjectProto((JSContext *)0x11ea4c,JVar4);
  local_138 = JVar4.u;
  *(JSValueUnion *)((long)JVar13.ptr + 0x178) = local_138;
  local_130 = JVar4.tag;
  *(int64_t *)((long)JVar13.ptr + 0x180) = local_130;
  proto_04.u._4_4_ = in_stack_fffffffffffffb14;
  proto_04.u.int32 = in_stack_fffffffffffffb10;
  proto_04.tag._0_4_ = in_stack_fffffffffffffb18;
  proto_04.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_NewGlobalCConstructor
            ((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),(char *)ctx_00,
             (JSCFunction *)CONCAT44(class_id,uVar7),length,proto_04);
  obj_00.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_00.u.int32 = uVar8;
  obj_00.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_00.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_00,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  obj_01.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_01.u.int32 = uVar8;
  obj_01.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_01.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_01,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  obj_02.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_02.u.int32 = uVar8;
  obj_02.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_02.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_02,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  JVar13 = in_RDI;
  JVar4 = JS_NewCFunctionMagic
                    (ctx_00,(undefined1 *)CONCAT44(class_id,uVar7),(char *)CONCAT44(length,uVar6),
                     atom,JVar5,0);
  local_168 = JVar4.u;
  *(JSValueUnion *)((long)JVar13.ptr + 0x58) = local_168;
  local_160 = JVar4.tag;
  *(int64_t *)((long)JVar13.ptr + 0x60) = local_160;
  JS_DupValue((JSContext *)in_RDI.ptr,*(JSValue *)((long)in_RDI.ptr + 0x58));
  func_obj_00.tag = (int64_t)in_stack_fffffffffffffb40.ptr;
  func_obj_00.u.ptr = in_stack_fffffffffffffb38.ptr;
  proto_10.tag._0_4_ = in_stack_fffffffffffffb30;
  proto_10.u.ptr = in_stack_fffffffffffffb28;
  proto_10.tag._4_4_ = in_stack_fffffffffffffb34;
  JS_NewGlobalCConstructor2
            ((JSContext *)in_stack_fffffffffffffb20.ptr,func_obj_00,
             (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),proto_10);
  JVar4 = JS_NewCFunctionMagic
                    (ctx_00,(undefined1 *)CONCAT44(class_id,uVar7),(char *)CONCAT44(length,uVar6),
                     atom,JVar5,0);
  func_obj_01.tag = (int64_t)in_stack_fffffffffffffb40.ptr;
  func_obj_01.u.ptr = in_stack_fffffffffffffb38.ptr;
  proto_11.tag._0_4_ = in_stack_fffffffffffffb30;
  proto_11.u.ptr = in_stack_fffffffffffffb28;
  proto_11.tag._4_4_ = in_stack_fffffffffffffb34;
  JS_NewGlobalCConstructor2
            ((JSContext *)in_stack_fffffffffffffb20.ptr,func_obj_01,
             (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),proto_11);
  for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
    JVar5 = JVar4.u._0_4_;
    atom = JVar4.u._4_4_;
    uVar6 = (undefined4)JVar4.tag;
    length = JVar4.tag._4_4_;
    proto_val_02.u._4_4_ = in_stack_fffffffffffffb54;
    proto_val_02.u.int32 = in_stack_fffffffffffffb50;
    proto_val_02.tag = in_stack_fffffffffffffb58;
    JS_NewCFunction3((JSContext *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20.ptr,
                     in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
                     proto_val_02);
    func_obj_02.tag = (int64_t)in_stack_fffffffffffffb40.ptr;
    func_obj_02.u.ptr = in_stack_fffffffffffffb38.ptr;
    proto_12.tag._0_4_ = in_stack_fffffffffffffb30;
    proto_12.u.ptr = in_stack_fffffffffffffb28;
    proto_12.tag._4_4_ = in_stack_fffffffffffffb34;
    JS_NewGlobalCConstructor2
              ((JSContext *)in_stack_fffffffffffffb20.ptr,func_obj_02,
               (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),proto_12);
  }
  JVar4 = JS_NewObject((JSContext *)0x11ee1a);
  *(JSValueUnion *)((long)in_RDI.ptr + 0x118) = JVar4.u;
  local_1b8 = JVar4.tag;
  *(int64_t *)((long)in_RDI.ptr + 0x120) = local_1b8;
  obj_03.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_03.u.int32 = uVar8;
  obj_03.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_03.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_03,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  obj_04.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_04.u.int32 = uVar8;
  obj_04.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_04.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_04,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  proto_05.u._4_4_ = in_stack_fffffffffffffb14;
  proto_05.u.int32 = in_stack_fffffffffffffb10;
  proto_05.tag._0_4_ = in_stack_fffffffffffffb18;
  proto_05.tag._4_4_ = in_stack_fffffffffffffb1c;
  JVar4 = JS_NewGlobalCConstructor
                    ((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),(char *)ctx_00,
                     (JSCFunction *)CONCAT44(class_id,uVar7),length,proto_05);
  JVar13 = in_RDI;
  JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,JVar4);
  *(JSValueUnion *)((long)JVar13.ptr + 0x68) = JVar4.u;
  *(int64_t *)((long)JVar13.ptr + 0x70) = JVar4.tag;
  obj_05.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_05.u.int32 = uVar8;
  obj_05.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_05.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_05,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  memcpy(local_238,"copyWithin",0x4a);
  proto.u._4_4_ = atom;
  proto.u.int32 = JVar5;
  proto.tag._0_4_ = uVar6;
  proto.tag._4_4_ = length;
  JS_NewObjectProto((JSContext *)0x11effc,proto);
  for (local_240 = local_238; throw_ref_error = in_stack_fffffffffffffce0._0_4_,
      auVar15 = in_stack_fffffffffffffc38._4_12_, *local_240 != '\0';
      local_240 = local_240 + sVar2 + 1) {
    this_obj.u._4_4_ = in_stack_fffffffffffffb1c;
    this_obj.u.int32 = in_stack_fffffffffffffb18;
    this_obj.tag = (int64_t)in_stack_fffffffffffffb20.ptr;
    val.u._4_4_ = in_stack_fffffffffffffb0c;
    val.u.int32 = uVar8;
    val.tag._0_4_ = in_stack_fffffffffffffb10;
    val.tag._4_4_ = in_stack_fffffffffffffb14;
    JS_DefinePropertyValueStr
              (ctx_00,this_obj,(char *)CONCAT44(class_id,uVar7),val,in_stack_fffffffffffffb30);
    sVar2 = strlen(local_240);
  }
  this_obj_01.u._4_4_ = in_stack_fffffffffffffb54;
  this_obj_01.u.int32 = in_stack_fffffffffffffb50;
  this_obj_01.tag = in_stack_fffffffffffffb58;
  val_04.tag = (int64_t)in_stack_fffffffffffffb48.ptr;
  val_04.u.float64 = in_stack_fffffffffffffb40.float64;
  JS_DefinePropertyValue
            ((JSContext *)in_stack_fffffffffffffb38.ptr,this_obj_01,in_stack_fffffffffffffb34,val_04
             ,in_stack_fffffffffffffb70);
  JVar5 = JS_CFUNC_generic;
  obj_23.tag = in_stack_fffffffffffffc60;
  obj_23.u.float64 = in_stack_fffffffffffffc58.float64;
  JVar13 = in_RDI;
  JVar4 = JS_GetPropertyInternal
                    (auVar15._4_8_,obj_23,auVar15._0_4_,in_stack_fffffffffffffc48,throw_ref_error);
  local_50 = JVar4.u;
  local_48 = JVar4.tag;
  *(JSValueUnion *)((long)JVar13.ptr + 0x138) = local_50;
  *(int64_t *)((long)JVar13.ptr + 0x140) = local_48;
  lVar1 = *(long *)((long)in_RDI.ptr + 0x40);
  proto_00.u._4_4_ = atom;
  proto_00.u.int32 = JVar5;
  proto_00.tag._0_4_ = uVar6;
  proto_00.tag._4_4_ = length;
  JVar4 = JS_NewObjectProto((JSContext *)0x11f1d3,proto_00);
  local_290 = JVar4.u;
  iStack_288 = JVar4.tag;
  *(JSValueUnion *)(lVar1 + 0x250) = local_290;
  *(int64_t *)(lVar1 + 600) = iStack_288;
  obj_06.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_06.u.int32 = uVar8;
  obj_06.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_06.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_06,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  iVar14 = 0xe;
  obj_07.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_07.u.int32 = uVar8;
  obj_07.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_07.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_07,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  lVar1 = *(long *)((long)in_RDI.ptr + 0x40);
  proto_val.u._4_4_ = in_stack_fffffffffffffb0c;
  proto_val.u.int32 = uVar8;
  proto_val.tag._0_4_ = in_stack_fffffffffffffb10;
  proto_val.tag._4_4_ = in_stack_fffffffffffffb14;
  JVar4 = JS_NewObjectProtoClass(ctx_00,proto_val,class_id);
  local_2a0 = JVar4.u;
  iStack_298 = JVar4.tag;
  *(JSValueUnion *)(lVar1 + 0x40) = local_2a0;
  *(int64_t *)(lVar1 + 0x48) = iStack_298;
  obj_20.tag = (int64_t)in_stack_fffffffffffffb28;
  obj_20.u.float64 = in_stack_fffffffffffffb20.float64;
  val_01.u._4_4_ = in_stack_fffffffffffffb14;
  val_01.u.int32 = in_stack_fffffffffffffb10;
  val_01.tag._0_4_ = in_stack_fffffffffffffb18;
  val_01.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_SetObjectData((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),obj_20,val_01);
  obj_08.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_08.u.int32 = uVar8;
  obj_08.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_08.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_08,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  proto_06.u._4_4_ = in_stack_fffffffffffffb14;
  proto_06.u.int32 = in_stack_fffffffffffffb10;
  proto_06.tag._0_4_ = in_stack_fffffffffffffb18;
  proto_06.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_NewGlobalCConstructor
            ((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),(char *)ctx_00,
             (JSCFunction *)CONCAT44(class_id,uVar7),length,proto_06);
  obj_09.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_09.u.int32 = uVar8;
  obj_09.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_09.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_09,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  lVar1 = *(long *)((long)in_RDI.ptr + 0x40);
  proto_val_00.u._4_4_ = in_stack_fffffffffffffb0c;
  proto_val_00.u.int32 = uVar8;
  proto_val_00.tag._0_4_ = in_stack_fffffffffffffb10;
  proto_val_00.tag._4_4_ = in_stack_fffffffffffffb14;
  JVar4 = JS_NewObjectProtoClass(ctx_00,proto_val_00,class_id);
  local_2d0 = JVar4.u;
  iStack_2c8 = JVar4.tag;
  *(JSValueUnion *)(lVar1 + 0x60) = local_2d0;
  *(int64_t *)(lVar1 + 0x68) = iStack_2c8;
  obj_21.tag = (int64_t)in_stack_fffffffffffffb28;
  obj_21.u.float64 = in_stack_fffffffffffffb20.float64;
  val_02.u._4_4_ = in_stack_fffffffffffffb14;
  val_02.u.int32 = in_stack_fffffffffffffb10;
  val_02.tag._0_4_ = in_stack_fffffffffffffb18;
  val_02.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_SetObjectData((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),obj_21,val_02);
  obj_10.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_10.u.int32 = uVar8;
  obj_10.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_10.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_10,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  proto_07.u._4_4_ = in_stack_fffffffffffffb14;
  proto_07.u.int32 = in_stack_fffffffffffffb10;
  proto_07.tag._0_4_ = in_stack_fffffffffffffb18;
  proto_07.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_NewGlobalCConstructor
            ((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),(char *)ctx_00,
             (JSCFunction *)CONCAT44(class_id,uVar7),length,proto_07);
  lVar1 = *(long *)((long)in_RDI.ptr + 0x40);
  proto_val_01.u._4_4_ = in_stack_fffffffffffffb0c;
  proto_val_01.u.int32 = uVar8;
  proto_val_01.tag._0_4_ = in_stack_fffffffffffffb10;
  proto_val_01.tag._4_4_ = in_stack_fffffffffffffb14;
  JVar4 = JS_NewObjectProtoClass(ctx_00,proto_val_01,class_id);
  *(JSValueUnion *)(lVar1 + 0x50) = JVar4.u;
  *(int64_t *)(lVar1 + 0x58) = JVar4.tag;
  JS_AtomToString((JSContext *)CONCAT44(length,uVar6),atom);
  obj_22.tag = (int64_t)in_stack_fffffffffffffb28;
  obj_22.u.float64 = in_stack_fffffffffffffb20.float64;
  val_03.u._4_4_ = in_stack_fffffffffffffb14;
  val_03.u.int32 = in_stack_fffffffffffffb10;
  val_03.tag._0_4_ = in_stack_fffffffffffffb18;
  val_03.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_SetObjectData((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),obj_22,val_03);
  proto_08.u._4_4_ = in_stack_fffffffffffffb14;
  proto_08.u.int32 = in_stack_fffffffffffffb10;
  proto_08.tag._0_4_ = in_stack_fffffffffffffb18;
  proto_08.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_NewGlobalCConstructor
            ((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),(char *)ctx_00,
             (JSCFunction *)CONCAT44(class_id,uVar7),length,proto_08);
  obj_11.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_11.u.int32 = uVar8;
  obj_11.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_11.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_11,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  obj_12.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_12.u.int32 = uVar8;
  obj_12.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_12.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_12,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  lVar1 = *(long *)((long)in_RDI.ptr + 0x40);
  proto_01.u._4_4_ = atom;
  proto_01.u.int32 = JVar5;
  proto_01.tag._0_4_ = uVar6;
  proto_01.tag._4_4_ = length;
  JVar4 = JS_NewObjectProto((JSContext *)0x11f6d4,proto_01);
  local_330 = JVar4.u;
  *(JSValueUnion *)(lVar1 + 0x260) = local_330;
  local_328 = JVar4.tag;
  *(int64_t *)(lVar1 + 0x268) = local_328;
  obj_13.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_13.u.int32 = uVar8;
  obj_13.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_13.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_13,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  js_random_init((JSContext *)CONCAT44(length,uVar6));
  obj_14.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_14.u.int32 = uVar8;
  obj_14.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_14.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_14,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  obj_15.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_15.u.int32 = uVar8;
  obj_15.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_15.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_15,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  lVar1 = *(long *)((long)in_RDI.ptr + 0x40);
  JVar4 = JS_NewObject((JSContext *)0x11f7cf);
  local_340 = JVar4.u;
  *(JSValueUnion *)(lVar1 + 0x70) = local_340;
  local_338 = JVar4.tag;
  *(int64_t *)(lVar1 + 0x78) = local_338;
  obj_16.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_16.u.int32 = uVar8;
  obj_16.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_16.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_16,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  proto_09.u._4_4_ = in_stack_fffffffffffffb14;
  proto_09.u.int32 = in_stack_fffffffffffffb10;
  proto_09.tag._0_4_ = in_stack_fffffffffffffb18;
  proto_09.tag._4_4_ = in_stack_fffffffffffffb1c;
  JS_NewGlobalCConstructor
            ((JSContext *)CONCAT44(in_stack_fffffffffffffb0c,uVar8),(char *)ctx_00,
             (JSCFunction *)CONCAT44(class_id,uVar7),length,proto_09);
  obj_17.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_17.u.int32 = uVar8;
  obj_17.tag._0_4_ = in_stack_fffffffffffffb10;
  obj_17.tag._4_4_ = in_stack_fffffffffffffb14;
  JS_SetPropertyFunctionList(ctx_00,obj_17,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  for (local_7c = 0xc5; local_7c < 0xd2; local_7c = local_7c + 1) {
    __s = JS_AtomGetStr((JSContext *)CONCAT44(length,uVar6),(char *)CONCAT44(atom,JVar5),0,0x11f8f8)
    ;
    pcVar3 = strchr(__s,0x2e);
    if (pcVar3 != (char *)0x0) {
      __s = pcVar3 + 1;
    }
    in_stack_fffffffffffffb50 = (int)__s;
    in_stack_fffffffffffffb54 = (undefined4)((ulong)__s >> 0x20);
    in_stack_fffffffffffffb48 = in_RDI;
    JS_AtomToValue((JSContext *)CONCAT44(length,uVar6),atom);
    JVar5 = JS_CFUNC_generic;
    this_obj_00.u._4_4_ = in_stack_fffffffffffffb1c;
    this_obj_00.u.int32 = in_stack_fffffffffffffb18;
    this_obj_00.tag = (int64_t)in_stack_fffffffffffffb20.ptr;
    val_00.u._4_4_ = in_stack_fffffffffffffb0c;
    val_00.u.int32 = uVar8;
    val_00.tag._0_4_ = in_stack_fffffffffffffb10;
    val_00.tag._4_4_ = in_stack_fffffffffffffb14;
    JS_DefinePropertyValueStr
              (ctx_00,this_obj_00,(char *)CONCAT44(class_id,uVar7),val_00,in_stack_fffffffffffffb30)
    ;
  }
  uVar9 = (undefined4)*(undefined8 *)((long)in_RDI.ptr + 0x40);
  uVar10 = (undefined4)((ulong)*(undefined8 *)((long)in_RDI.ptr + 0x40) >> 0x20);
  proto_02.u._4_4_ = atom;
  proto_02.u.int32 = JVar5;
  proto_02.tag._0_4_ = uVar6;
  proto_02.tag._4_4_ = length;
  JVar4 = JS_NewObjectProto((JSContext *)0x11f9f9,proto_02);
  *(JSValueUnion *)(CONCAT44(uVar10,uVar9) + 0x280) = JVar4.u;
  *(int64_t *)(CONCAT44(uVar10,uVar9) + 0x288) = JVar4.tag;
  obj_18.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_18.u.int32 = uVar8;
  obj_18.tag._0_4_ = uVar9;
  obj_18.tag._4_4_ = uVar10;
  JS_SetPropertyFunctionList(ctx_00,obj_18,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  uVar11 = (undefined4)*(undefined8 *)((long)in_RDI.ptr + 0x40);
  proto_flags = (int)((ulong)*(undefined8 *)((long)in_RDI.ptr + 0x40) >> 0x20);
  proto_03.u._4_4_ = atom;
  proto_03.u.int32 = JVar5;
  proto_03.tag._0_4_ = uVar6;
  proto_03.tag._4_4_ = length;
  JVar4 = JS_NewObjectProto((JSContext *)0x11fa91,proto_03);
  local_3d8 = JVar4.u;
  *(JSValueUnion *)(CONCAT44(proto_flags,uVar11) + 0x100) = local_3d8;
  local_3d0 = JVar4.tag;
  *(int64_t *)(CONCAT44(proto_flags,uVar11) + 0x108) = local_3d0;
  JS_NewCFunctionMagic
            (ctx_00,(undefined1 *)CONCAT44(class_id,uVar7),(char *)CONCAT44(length,uVar6),atom,JVar5
             ,0);
  obj_19.u._4_4_ = in_stack_fffffffffffffb0c;
  obj_19.u.int32 = uVar8;
  obj_19.tag._0_4_ = uVar9;
  obj_19.tag._4_4_ = uVar10;
  JS_SetPropertyFunctionList(ctx_00,obj_19,(JSCFunctionListEntry *)CONCAT44(class_id,uVar7),length);
  func_obj_03.tag = (int64_t)in_stack_fffffffffffffb40.ptr;
  func_obj_03.u.ptr = in_stack_fffffffffffffb38.ptr;
  proto_13.tag._0_4_ = in_stack_fffffffffffffb30;
  proto_13.u.ptr = in_stack_fffffffffffffb28;
  proto_13.tag._4_4_ = in_stack_fffffffffffffb34;
  JS_SetConstructor2((JSContext *)in_stack_fffffffffffffb20.ptr,func_obj_03,proto_13,proto_flags,
                     in_stack_fffffffffffffb50);
  func_obj_04.tag = (int64_t)in_stack_fffffffffffffb40.ptr;
  func_obj_04.u.ptr = in_stack_fffffffffffffb38.ptr;
  proto_14.tag._0_4_ = in_stack_fffffffffffffb30;
  proto_14.u.ptr = in_stack_fffffffffffffb28;
  proto_14.tag._4_4_ = in_stack_fffffffffffffb34;
  JS_SetConstructor2((JSContext *)in_stack_fffffffffffffb20.ptr,func_obj_04,proto_14,proto_flags,
                     in_stack_fffffffffffffb50);
  v_01.u._4_4_ = class_id;
  v_01.u.int32 = uVar7;
  v_01.tag = (int64_t)ctx_00;
  JS_FreeValue((JSContext *)CONCAT44(length,uVar6),v_01);
  JVar12 = in_RDI;
  JVar4 = JS_NewCFunction(ctx_00,(JSCFunction *)CONCAT44(class_id,uVar7),
                          (char *)CONCAT44(length,uVar6),atom);
  local_3f8 = JVar4.u;
  *(JSValueUnion *)((long)JVar12.ptr + 0x158) = local_3f8;
  local_3f0 = JVar4.tag;
  *(int64_t *)((long)JVar12.ptr + 0x160) = local_3f0;
  JS_DupValue((JSContext *)in_RDI.ptr,*(JSValue *)((long)in_RDI.ptr + 0x158));
  this_obj_02.u._4_4_ = in_stack_fffffffffffffb54;
  this_obj_02.u.int32 = in_stack_fffffffffffffb50;
  this_obj_02.tag = (int64_t)JVar13.ptr;
  val_05.tag = (int64_t)in_stack_fffffffffffffb48.ptr;
  val_05.u.float64 = in_stack_fffffffffffffb40.float64;
  JS_DefinePropertyValue((JSContext *)in_stack_fffffffffffffb38.ptr,this_obj_02,prop,val_05,iVar14);
  JVar12 = in_RDI;
  JS_DupValue((JSContext *)in_RDI.ptr,*(JSValue *)((long)in_RDI.ptr + 0x168));
  this_obj_03.u._4_4_ = in_stack_fffffffffffffb54;
  this_obj_03.u.int32 = in_stack_fffffffffffffb50;
  this_obj_03.tag = (int64_t)JVar13.ptr;
  val_06.tag = (int64_t)in_stack_fffffffffffffb48.ptr;
  val_06.u.float64 = JVar12.float64;
  JS_DefinePropertyValue((JSContext *)in_RDI.ptr,this_obj_03,prop,val_06,iVar14);
  return;
}

Assistant:

void JS_AddIntrinsicBaseObjects(JSContext *ctx)
{
    int i;
    JSValueConst obj, number_obj;
    JSValue obj1;

    ctx->throw_type_error = JS_NewCFunction(ctx, js_throw_type_error, NULL, 0);

    /* add caller and arguments properties to throw a TypeError */
    obj1 = JS_NewCFunction(ctx, js_function_proto_caller, NULL, 0);
    JS_DefineProperty(ctx, ctx->function_proto, JS_ATOM_caller, JS_UNDEFINED,
                      obj1, ctx->throw_type_error,
                      JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                      JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE);
    JS_DefineProperty(ctx, ctx->function_proto, JS_ATOM_arguments, JS_UNDEFINED,
                      obj1, ctx->throw_type_error,
                      JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                      JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);
    JS_FreeValue(ctx, js_object_seal(ctx, JS_UNDEFINED, 1, (JSValueConst *)&ctx->throw_type_error, 1));

    ctx->global_obj = JS_NewObject(ctx);
    ctx->global_var_obj = JS_NewObjectProto(ctx, JS_NULL);

    /* Object */
    obj = JS_NewGlobalCConstructor(ctx, "Object", js_object_constructor, 1,
                                   ctx->class_proto[JS_CLASS_OBJECT]);
    JS_SetPropertyFunctionList(ctx, obj, js_object_funcs, countof(js_object_funcs));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                               js_object_proto_funcs, countof(js_object_proto_funcs));

    /* Function */
    JS_SetPropertyFunctionList(ctx, ctx->function_proto, js_function_proto_funcs, countof(js_function_proto_funcs));
    ctx->function_ctor = JS_NewCFunctionMagic(ctx, js_function_constructor,
                                              "Function", 1, JS_CFUNC_constructor_or_func_magic,
                                              JS_FUNC_NORMAL);
    JS_NewGlobalCConstructor2(ctx, JS_DupValue(ctx, ctx->function_ctor), "Function",
                              ctx->function_proto);

    /* Error */
    obj1 = JS_NewCFunctionMagic(ctx, js_error_constructor,
                                "Error", 1, JS_CFUNC_constructor_or_func_magic, -1);
    JS_NewGlobalCConstructor2(ctx, obj1,
                              "Error", ctx->class_proto[JS_CLASS_ERROR]);

    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        JSValue func_obj;
        int n_args;
        n_args = 1 + (i == JS_AGGREGATE_ERROR);
        func_obj = JS_NewCFunction3(ctx, (JSCFunction *)js_error_constructor,
                                    native_error_name[i], n_args,
                                    JS_CFUNC_constructor_or_func_magic, i, obj1);
        JS_NewGlobalCConstructor2(ctx, func_obj, native_error_name[i],
                                  ctx->native_error_proto[i]);
    }

    /* Iterator prototype */
    ctx->iterator_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->iterator_proto,
                               js_iterator_proto_funcs,
                               countof(js_iterator_proto_funcs));

    /* Array */
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY],
                               js_array_proto_funcs,
                               countof(js_array_proto_funcs));

    obj = JS_NewGlobalCConstructor(ctx, "Array", js_array_constructor, 1,
                                   ctx->class_proto[JS_CLASS_ARRAY]);
    ctx->array_ctor = JS_DupValue(ctx, obj);
    JS_SetPropertyFunctionList(ctx, obj, js_array_funcs,
                               countof(js_array_funcs));

    /* XXX: create auto_initializer */
    {
        /* initialize Array.prototype[Symbol.unscopables] */
        char const unscopables[] = "copyWithin" "\0" "entries" "\0" "fill" "\0" "find" "\0"
            "findIndex" "\0" "flat" "\0" "flatMap" "\0" "includes" "\0" "keys" "\0" "values" "\0";
        const char *p = unscopables;
        obj1 = JS_NewObjectProto(ctx, JS_NULL);
        for(p = unscopables; *p; p += strlen(p) + 1) {
            JS_DefinePropertyValueStr(ctx, obj1, p, JS_TRUE, JS_PROP_C_W_E);
        }
        JS_DefinePropertyValue(ctx, ctx->class_proto[JS_CLASS_ARRAY],
                               JS_ATOM_Symbol_unscopables, obj1,
                               JS_PROP_CONFIGURABLE);
    }

    /* needed to initialize arguments[Symbol.iterator] */
    ctx->array_proto_values =
        JS_GetProperty(ctx, ctx->class_proto[JS_CLASS_ARRAY], JS_ATOM_values);

    ctx->class_proto[JS_CLASS_ARRAY_ITERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY_ITERATOR],
                               js_array_iterator_proto_funcs,
                               countof(js_array_iterator_proto_funcs));

    /* parseFloat and parseInteger must be defined before Number
       because of the Number.parseFloat and Number.parseInteger
       aliases */
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_global_funcs,
                               countof(js_global_funcs));

    /* Number */
    ctx->class_proto[JS_CLASS_NUMBER] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                               JS_CLASS_NUMBER);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_NUMBER], JS_NewInt32(ctx, 0));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_NUMBER],
                               js_number_proto_funcs,
                               countof(js_number_proto_funcs));
    number_obj = JS_NewGlobalCConstructor(ctx, "Number", js_number_constructor, 1,
                                          ctx->class_proto[JS_CLASS_NUMBER]);
    JS_SetPropertyFunctionList(ctx, number_obj, js_number_funcs, countof(js_number_funcs));

    /* Boolean */
    ctx->class_proto[JS_CLASS_BOOLEAN] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                                JS_CLASS_BOOLEAN);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_BOOLEAN], JS_NewBool(ctx, FALSE));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_BOOLEAN], js_boolean_proto_funcs,
                               countof(js_boolean_proto_funcs));
    JS_NewGlobalCConstructor(ctx, "Boolean", js_boolean_constructor, 1,
                             ctx->class_proto[JS_CLASS_BOOLEAN]);

    /* String */
    ctx->class_proto[JS_CLASS_STRING] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                               JS_CLASS_STRING);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_STRING], JS_AtomToString(ctx, JS_ATOM_empty_string));
    obj = JS_NewGlobalCConstructor(ctx, "String", js_string_constructor, 1,
                                   ctx->class_proto[JS_CLASS_STRING]);
    JS_SetPropertyFunctionList(ctx, obj, js_string_funcs,
                               countof(js_string_funcs));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_STRING], js_string_proto_funcs,
                               countof(js_string_proto_funcs));

    ctx->class_proto[JS_CLASS_STRING_ITERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_STRING_ITERATOR],
                               js_string_iterator_proto_funcs,
                               countof(js_string_iterator_proto_funcs));

    /* Math: create as autoinit object */
    js_random_init(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_math_obj, countof(js_math_obj));

    /* ES6 Reflect: create as autoinit object */
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_reflect_obj, countof(js_reflect_obj));

    /* ES6 Symbol */
    ctx->class_proto[JS_CLASS_SYMBOL] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_SYMBOL], js_symbol_proto_funcs,
                               countof(js_symbol_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "Symbol", js_symbol_constructor, 0,
                                   ctx->class_proto[JS_CLASS_SYMBOL]);
    JS_SetPropertyFunctionList(ctx, obj, js_symbol_funcs,
                               countof(js_symbol_funcs));
    for(i = JS_ATOM_Symbol_toPrimitive; i < JS_ATOM_END; i++) {
        char buf[ATOM_GET_STR_BUF_SIZE];
        const char *str, *p;
        str = JS_AtomGetStr(ctx, buf, sizeof(buf), i);
        /* skip "Symbol." */
        p = strchr(str, '.');
        if (p)
            str = p + 1;
        JS_DefinePropertyValueStr(ctx, obj, str, JS_AtomToValue(ctx, i), 0);
    }

    /* ES6 Generator */
    ctx->class_proto[JS_CLASS_GENERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_GENERATOR],
                               js_generator_proto_funcs,
                               countof(js_generator_proto_funcs));

    ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION] = JS_NewObjectProto(ctx, ctx->function_proto);
    obj1 = JS_NewCFunctionMagic(ctx, js_function_constructor,
                                "GeneratorFunction", 1,
                                JS_CFUNC_constructor_or_func_magic, JS_FUNC_GENERATOR);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                               js_generator_function_proto_funcs,
                               countof(js_generator_function_proto_funcs));
    JS_SetConstructor2(ctx, ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                       ctx->class_proto[JS_CLASS_GENERATOR],
                       JS_PROP_CONFIGURABLE, JS_PROP_CONFIGURABLE);
    JS_SetConstructor2(ctx, obj1, ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                       0, JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);

    /* global properties */
    ctx->eval_obj = JS_NewCFunction(ctx, js_global_eval, "eval", 1);
    JS_DefinePropertyValue(ctx, ctx->global_obj, JS_ATOM_eval,
                           JS_DupValue(ctx, ctx->eval_obj),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);

    JS_DefinePropertyValue(ctx, ctx->global_obj, JS_ATOM_globalThis,
                           JS_DupValue(ctx, ctx->global_obj),
                           JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE);
}